

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Table_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTableDecl
          (Result<wasm::Table_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames,TableType type)

{
  int __val;
  Table *pTVar1;
  _Storage<unsigned_long,_true> _Var2;
  _Variant_storage<false,wasm::Table*,wasm::Err> *p_Var3;
  char *pcVar4;
  string_view sVar5;
  string local_b8;
  string local_98;
  string_view local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Variant_storage<false,wasm::Table*,wasm::Err> *local_48;
  Index local_3c;
  _Head_base<0UL,_wasm::Table_*,_false> local_38;
  __single_object t;
  
  local_48 = (_Variant_storage<false,wasm::Table*,wasm::Err> *)__return_storage_ptr__;
  local_3c = pos;
  std::make_unique<wasm::Table>();
  ((local_38._M_head_impl)->addressType).id = type.addressType.id;
  ((local_38._M_head_impl)->initial).addr = type.limits.initial;
  _Var2._M_value = 0xffffffff;
  if (type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged != false) {
    _Var2._M_value =
         type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload._M_value;
  }
  ((local_38._M_head_impl)->max).addr = (address64_t)_Var2;
  if (name.super_IString.str._M_str == (char *)0x0) {
    __val = this->tableCounter;
    this->tableCounter = __val + 1;
    std::__cxx11::to_string(&local_98,__val);
    pcVar4 = "timport$";
    if (importNames == (ImportNames *)0x0) {
      pcVar4 = "";
    }
    std::operator+(&local_68,pcVar4,&local_98);
    IString::IString((IString *)&local_78,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_98);
    sVar5 = (string_view)Names::getValidTableName(this->wasm,(Name)local_78);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar5;
  }
  else {
    pTVar1 = Module::getTableOrNull(this->wasm,name);
    if (pTVar1 != (Table *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"repeated table name",(allocator<char> *)&local_98);
      Lexer::err((Err *)&local_68,&this->in,(ulong)local_3c,&local_b8);
      p_Var3 = local_48;
      std::__detail::__variant::_Variant_storage<false,wasm::Table*,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>(local_48,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_b8);
      goto LAB_00bfdf51;
    }
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         name.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         name.super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
  }
  if (importNames != (ImportNames *)0x0) {
    pcVar4 = (importNames->mod).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         (importNames->mod).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar4;
    pcVar4 = (importNames->nm).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         (importNames->nm).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar4;
  }
  pTVar1 = Module::addTable(this->wasm,
                            (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_38)
  ;
  *(Table **)local_48 = pTVar1;
  local_48[0x20] = (_Variant_storage<false,wasm::Table*,wasm::Err>)0x0;
  p_Var3 = local_48;
LAB_00bfdf51:
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
            ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_38);
  return (Result<wasm::Table_*> *)p_Var3;
}

Assistant:

Result<Table*> ParseDeclsCtx::addTableDecl(Index pos,
                                           Name name,
                                           ImportNames* importNames,
                                           TableType type) {
  auto t = std::make_unique<Table>();
  t->addressType = type.addressType;
  t->initial = type.limits.initial;
  t->max = type.limits.max ? *type.limits.max : Table::kUnlimitedSize;
  if (name.is()) {
    if (wasm.getTableOrNull(name)) {
      // TODO: if the existing table is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated table name");
    }
    t->setExplicitName(name);
  } else {
    name = (importNames ? "timport$" : "") + std::to_string(tableCounter++);
    name = Names::getValidTableName(wasm, name);
    t->name = name;
  }
  applyImportNames(*t, importNames);
  return wasm.addTable(std::move(t));
}